

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O3

int mbedtls_poly1305_mac(uchar *key,uchar *input,size_t ilen,uchar *mac)

{
  mbedtls_poly1305_context ctx;
  mbedtls_poly1305_context mStack_78;
  
  mbedtls_platform_zeroize(&mStack_78,0x50);
  mbedtls_poly1305_starts(&mStack_78,key);
  mbedtls_poly1305_update(&mStack_78,input,ilen);
  mbedtls_poly1305_finish(&mStack_78,mac);
  mbedtls_platform_zeroize(&mStack_78,0x50);
  return 0;
}

Assistant:

int mbedtls_poly1305_mac( const unsigned char key[32],
                          const unsigned char *input,
                          size_t ilen,
                          unsigned char mac[16] )
{
    mbedtls_poly1305_context ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    POLY1305_VALIDATE_RET( key != NULL );
    POLY1305_VALIDATE_RET( mac != NULL );
    POLY1305_VALIDATE_RET( ilen == 0 || input != NULL );

    mbedtls_poly1305_init( &ctx );

    ret = mbedtls_poly1305_starts( &ctx, key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_update( &ctx, input, ilen );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_finish( &ctx, mac );

cleanup:
    mbedtls_poly1305_free( &ctx );
    return( ret );
}